

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_compress_status_t
lzham::lzham_lib_compress2
          (lzham_compress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_flush_t flush_type)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  byte_vec *this;
  uchar *puVar5;
  ulong uVar6;
  undefined4 uVar7;
  void *in_RCX;
  ulong *in_RDX;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  int in_R9D;
  bool has_no_more_output;
  size_t num_comp_bytes_to_output;
  bool consumed_entire_input_buf;
  size_t bytes_to_put;
  size_t cMaxBytesToPutPerIteration;
  bool has_no_more_output_1;
  size_t n;
  size_t num_bytes_written_to_out_buf;
  byte_vec *comp_data;
  lzham_compress_state *pState;
  undefined8 in_stack_ffffffffffffff40;
  lzham_flush_t flush_type_00;
  lzcompressor *in_stack_ffffffffffffff48;
  ulong local_b0;
  undefined8 in_stack_ffffffffffffff68;
  size_t sVar8;
  void *pBuf;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  ulong local_50;
  void *local_28;
  lzham_compress_status_t local_4;
  
  uVar4 = (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if ((((in_RDI == 0) || (*(int *)(in_RDI + 0xc0f684) == 0)) || (2 < *(uint *)(in_RDI + 0xc0f6b8)))
     || ((in_RDX == (ulong *)0x0 || (in_R8 == (ulong *)0x0)))) {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  else if ((*in_RDX == 0) || (in_RSI != 0)) {
    if ((*in_R8 == 0) || (in_RCX == (void *)0x0)) {
      local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
    }
    else {
      this = lzcompressor::get_compressed_data((lzcompressor *)(in_RDI + 0xa58));
      local_50 = 0;
      pBuf = *(void **)(in_RDI + 0xc0f670);
      uVar3 = vector<unsigned_char>::size(this);
      local_28 = in_RCX;
      if (pBuf < (void *)(ulong)uVar3) {
        uVar4 = vector<unsigned_char>::size(this);
        if ((ulong)uVar4 - *(long *)(in_RDI + 0xc0f670) < *in_R8) {
          uVar4 = vector<unsigned_char>::size(this);
          local_50 = (ulong)uVar4 - *(long *)(in_RDI + 0xc0f670);
        }
        else {
          local_50 = *in_R8;
        }
        sVar8 = local_50;
        puVar5 = vector<unsigned_char>::get_ptr(this);
        uVar4 = (uint)(sVar8 >> 0x20);
        memcpy(in_RCX,puVar5 + *(long *)(in_RDI + 0xc0f670),local_50);
        *(ulong *)(in_RDI + 0xc0f670) = local_50 + *(long *)(in_RDI + 0xc0f670);
        uVar1 = *(ulong *)(in_RDI + 0xc0f670);
        uVar3 = vector<unsigned_char>::size(this);
        if (uVar1 < uVar3) {
          *in_RDX = 0;
          *in_R8 = local_50;
          *(undefined4 *)(in_RDI + 0xc0f6b8) = 2;
          return *(lzham_compress_status_t *)(in_RDI + 0xc0f6b8);
        }
        local_28 = (void *)(local_50 + (long)in_RCX);
        *in_R8 = *in_R8 - local_50;
      }
      flush_type_00 = (lzham_flush_t)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      vector<unsigned_char>::try_resize
                ((vector<unsigned_char> *)in_stack_ffffffffffffff48,flush_type_00,
                 SUB81((ulong)in_stack_ffffffffffffff40 >> 0x18,0));
      *(undefined8 *)(in_RDI + 0xc0f670) = 0;
      if ((*(byte *)(in_RDI + 0xc0f678) & 1) == 0) {
        if (*in_RDX < 0x400001) {
          local_b0 = *in_RDX;
        }
        else {
          local_b0 = 0x400000;
        }
        uVar1 = *in_RDX;
        if ((local_b0 == 0) ||
           (bVar2 = lzcompressor::put_bytes
                              ((lzcompressor *)
                               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),pBuf,
                               uVar4), bVar2)) {
          if ((local_b0 == uVar1) && (in_R9D != 0)) {
            if (((in_R9D == 2) || (in_R9D == 3)) || (in_R9D == 10)) {
              bVar2 = lzcompressor::flush(in_stack_ffffffffffffff48,flush_type_00);
              if (!bVar2) {
                *in_RDX = 0;
                *in_R8 = local_50;
                *(undefined4 *)(in_RDI + 0xc0f6b8) = 4;
                return *(lzham_compress_status_t *)(in_RDI + 0xc0f6b8);
              }
            }
            else if ((*(byte *)(in_RDI + 0xc0f678) & 1) == 0) {
              bVar2 = lzcompressor::put_bytes
                                ((lzcompressor *)
                                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),pBuf,
                                 uVar4);
              if (!bVar2) {
                *in_RDX = 0;
                *in_R8 = local_50;
                *(undefined4 *)(in_RDI + 0xc0f6b8) = 4;
                return *(lzham_compress_status_t *)(in_RDI + 0xc0f6b8);
              }
              *(undefined1 *)(in_RDI + 0xc0f678) = 1;
            }
          }
          uVar4 = vector<unsigned_char>::size(this);
          if ((ulong)uVar4 - *(long *)(in_RDI + 0xc0f670) < *in_R8) {
            uVar4 = vector<unsigned_char>::size(this);
            uVar6 = (ulong)uVar4 - *(long *)(in_RDI + 0xc0f670);
          }
          else {
            uVar6 = *in_R8;
          }
          if (uVar6 != 0) {
            puVar5 = vector<unsigned_char>::get_ptr(this);
            memcpy(local_28,puVar5 + *(long *)(in_RDI + 0xc0f670),uVar6);
            *(ulong *)(in_RDI + 0xc0f670) = uVar6 + *(long *)(in_RDI + 0xc0f670);
          }
          *in_RDX = local_b0;
          *in_R8 = local_50 + uVar6;
          uVar6 = *(ulong *)(in_RDI + 0xc0f670);
          uVar4 = vector<unsigned_char>::size(this);
          bVar2 = uVar4 <= uVar6;
          if (((bVar2) && (in_R9D == 4)) && ((*(byte *)(in_RDI + 0xc0f678) & 1) != 0)) {
            *(undefined4 *)(in_RDI + 0xc0f6b8) = 3;
          }
          else if (((bVar2) && (local_b0 == uVar1)) && (in_R9D == 0)) {
            *(undefined4 *)(in_RDI + 0xc0f6b8) = 1;
          }
          else {
            uVar7 = 2;
            if (bVar2) {
              uVar7 = 0;
            }
            *(undefined4 *)(in_RDI + 0xc0f6b8) = uVar7;
          }
          local_4 = *(lzham_compress_status_t *)(in_RDI + 0xc0f6b8);
        }
        else {
          *in_RDX = 0;
          *in_R8 = local_50;
          *(undefined4 *)(in_RDI + 0xc0f6b8) = 4;
          local_4 = *(lzham_compress_status_t *)(in_RDI + 0xc0f6b8);
        }
      }
      else if ((*in_RDX == 0) && (in_R9D == 4)) {
        *in_RDX = 0;
        *in_R8 = local_50;
        *(undefined4 *)(in_RDI + 0xc0f6b8) = 3;
        local_4 = *(lzham_compress_status_t *)(in_RDI + 0xc0f6b8);
      }
      else {
        *(undefined4 *)(in_RDI + 0xc0f6b8) = 6;
        local_4 = *(lzham_compress_status_t *)(in_RDI + 0xc0f6b8);
      }
    }
  }
  else {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  return local_4;
}

Assistant:

lzham_compress_status_t LZHAM_CDECL lzham_lib_compress2(
      lzham_compress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_flush_t flush_type)
   {
      lzham_compress_state *pState = static_cast<lzham_compress_state*>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (pState->m_status >= LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         LZHAM_LOG_ERROR(6012);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         LZHAM_LOG_ERROR(6013);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if ((!*pOut_buf_size) || (!pOut_buf))
      {
         LZHAM_LOG_ERROR(6014);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      byte_vec &comp_data = pState->m_compressor.get_compressed_data();
      size_t num_bytes_written_to_out_buf = 0;
      if (pState->m_comp_data_ofs < comp_data.size())
      {
         size_t n = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);

         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, n);

         pState->m_comp_data_ofs += n;

         const bool has_no_more_output = (pState->m_comp_data_ofs >= comp_data.size());
         if (has_no_more_output)
         {
            pOut_buf += n;
            *pOut_buf_size -= n;
            num_bytes_written_to_out_buf += n;
         }
         else
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = n;
            pState->m_status = LZHAM_COMP_STATUS_HAS_MORE_OUTPUT;
            return pState->m_status;
         }
      }

      comp_data.try_resize(0);
      pState->m_comp_data_ofs = 0;

      if (pState->m_finished_compression)
      {
         if ((*pIn_buf_size) || (flush_type != LZHAM_FINISH))
         {
            pState->m_status = LZHAM_COMP_STATUS_INVALID_PARAMETER;
            LZHAM_LOG_ERROR(6015);
            return pState->m_status;
         }

         *pIn_buf_size = 0;
         *pOut_buf_size = num_bytes_written_to_out_buf;

         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
         return pState->m_status;
      }

      const size_t cMaxBytesToPutPerIteration = 4*1024*1024;
      size_t bytes_to_put = LZHAM_MIN(cMaxBytesToPutPerIteration, *pIn_buf_size);
      const bool consumed_entire_input_buf = (bytes_to_put == *pIn_buf_size);

      if (bytes_to_put)
      {
         if (!pState->m_compressor.put_bytes(pIn_buf, (uint)bytes_to_put))
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = num_bytes_written_to_out_buf;
            pState->m_status = LZHAM_COMP_STATUS_FAILED;
            LZHAM_LOG_ERROR(6016);
            return pState->m_status;
         }
      }

      if ((consumed_entire_input_buf) && (flush_type != LZHAM_NO_FLUSH))
      {
         if ((flush_type == LZHAM_SYNC_FLUSH) || (flush_type == LZHAM_FULL_FLUSH) || (flush_type == LZHAM_TABLE_FLUSH))
         {
            if (!pState->m_compressor.flush(flush_type))
            {
               *pIn_buf_size = 0;
               *pOut_buf_size = num_bytes_written_to_out_buf;
               pState->m_status = LZHAM_COMP_STATUS_FAILED;
               LZHAM_LOG_ERROR(6017);
               return pState->m_status;
            }
         }
         else if (!pState->m_finished_compression)
         {
            if (!pState->m_compressor.put_bytes(NULL, 0))
            {
               *pIn_buf_size = 0;
               *pOut_buf_size = num_bytes_written_to_out_buf;
               pState->m_status = LZHAM_COMP_STATUS_FAILED;
               LZHAM_LOG_ERROR(6018);
               return pState->m_status;
            }
            pState->m_finished_compression = true;
         }
      }

      size_t num_comp_bytes_to_output = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);
      if (num_comp_bytes_to_output)
      {
         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, num_comp_bytes_to_output);

         pState->m_comp_data_ofs += num_comp_bytes_to_output;
      }

      *pIn_buf_size = bytes_to_put;
      *pOut_buf_size = num_bytes_written_to_out_buf + num_comp_bytes_to_output;

      const bool has_no_more_output = (pState->m_comp_data_ofs >= comp_data.size());
      if ((has_no_more_output) && (flush_type == LZHAM_FINISH) && (pState->m_finished_compression))
         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
      else if ((has_no_more_output) && (consumed_entire_input_buf) && (flush_type == LZHAM_NO_FLUSH))
         pState->m_status = LZHAM_COMP_STATUS_NEEDS_MORE_INPUT;
      else
         pState->m_status = has_no_more_output ? LZHAM_COMP_STATUS_NOT_FINISHED : LZHAM_COMP_STATUS_HAS_MORE_OUTPUT;

      return pState->m_status;
   }